

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint64_t *puVar4;
  _Bool _Var5;
  int iVar6;
  array_container_t *paVar7;
  bitset_container_t *pbVar8;
  ulong uVar9;
  ulong uVar10;
  int32_t rlepos;
  long lVar11;
  uint32_t uVar12;
  int size;
  int32_t iVar13;
  int32_t rlepos_1;
  ulong uVar14;
  uint uVar15;
  
  _Var5 = run_container_is_full(src_1);
  if (_Var5) {
    if ((bitset_container_t *)*dst == src_2) {
      uVar14 = 1;
      goto LAB_0010b85b;
    }
    paVar7 = (array_container_t *)bitset_container_clone(src_2);
  }
  else {
    iVar6 = run_container_cardinality(src_1);
    if (iVar6 < 0x1001) {
      size = src_2->cardinality;
      if (iVar6 < src_2->cardinality) {
        size = iVar6;
      }
      paVar7 = array_container_create_given_capacity(size);
      *dst = paVar7;
      uVar14 = 0;
      if (paVar7 != (array_container_t *)0x0) {
        uVar9 = (ulong)(uint)src_1->n_runs;
        if (src_1->n_runs < 1) {
          uVar9 = uVar14;
        }
        for (; uVar14 != uVar9; uVar14 = uVar14 + 1) {
          uVar1 = src_1->runs[uVar14].value;
          uVar2 = src_1->runs[uVar14].length;
          puVar3 = paVar7->array;
          puVar4 = src_2->words;
          iVar13 = paVar7->cardinality;
          for (uVar10 = (ulong)uVar1; (uint)uVar10 <= (uint)uVar2 + (uint)uVar1;
              uVar10 = (ulong)((uint)uVar10 + 1)) {
            puVar3[iVar13] = (uint16_t)uVar10;
            iVar13 = iVar13 + (uint)((*(ulong *)((long)puVar4 +
                                                (ulong)((uint)(uVar10 >> 3) & 0x1ff8)) >>
                                      (uVar10 & 0x3f) & 1) != 0);
          }
          paVar7->cardinality = iVar13;
        }
        uVar14 = 0;
      }
      goto LAB_0010b85b;
    }
    pbVar8 = (bitset_container_t *)*dst;
    if (pbVar8 == src_2) {
      uVar12 = 0;
      for (lVar11 = 0; lVar11 < src_1->n_runs; lVar11 = lVar11 + 1) {
        uVar15 = (uint)src_1->runs[lVar11].value;
        uVar1 = src_1->runs[lVar11].length;
        bitset_reset_range(src_2->words,uVar12,uVar15);
        uVar12 = uVar15 + 1 + (uint)uVar1;
      }
      bitset_reset_range(src_2->words,uVar12,0x10000);
      iVar6 = bitset_container_compute_cardinality(pbVar8);
      pbVar8->cardinality = iVar6;
      uVar14 = 1;
      if (0x1000 < src_2->cardinality) goto LAB_0010b85b;
      paVar7 = array_container_from_bitset(src_2);
    }
    else {
      pbVar8 = bitset_container_clone(src_2);
      *dst = pbVar8;
      uVar14 = 1;
      if (pbVar8 == (bitset_container_t *)0x0) goto LAB_0010b85b;
      uVar12 = 0;
      for (lVar11 = 0; lVar11 < src_1->n_runs; lVar11 = lVar11 + 1) {
        uVar15 = (uint)src_1->runs[lVar11].value;
        uVar1 = src_1->runs[lVar11].length;
        bitset_reset_range(pbVar8->words,uVar12,uVar15);
        uVar12 = uVar1 + uVar15 + 1;
      }
      bitset_reset_range(pbVar8->words,uVar12,0x10000);
      iVar6 = bitset_container_compute_cardinality(pbVar8);
      pbVar8->cardinality = iVar6;
      if (0x1000 < iVar6) goto LAB_0010b85b;
      paVar7 = array_container_from_bitset(pbVar8);
      bitset_container_free((bitset_container_t *)*dst);
    }
  }
  *dst = paVar7;
  uVar14 = (ulong)_Var5;
LAB_0010b85b:
  return SUB81(uVar14,0);
}

Assistant:

bool run_bitset_container_intersection(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}